

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

string * __thiscall
args::EitherFlag::str_abi_cxx11_(string *__return_storage_ptr__,EitherFlag *this)

{
  if (this->isShort == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->longFlag);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
        {
            return isShort ? std::string(1, shortFlag) : longFlag;
        }